

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcopy.cpp
# Opt level: O0

int main(void)

{
  Am_Style local_38 [8];
  Am_Style local_30 [24];
  Am_Style local_18 [12];
  undefined4 local_c;
  
  local_c = 0;
  init_windows();
  init_point_lists();
  Am_Style::Am_Style(local_18,(Am_Style *)&black);
  draw_point_lists(local_18);
  Am_Style::~Am_Style(local_18);
  printf("Hit RETURN to apply change to point-list in D2: \n");
  getchar();
  Am_Style::Am_Style(local_30,(Am_Style *)&white);
  draw_point_lists(local_30);
  Am_Style::~Am_Style(local_30);
  change_left_point_lists();
  Am_Style::Am_Style(local_38,(Am_Style *)&black);
  draw_point_lists(local_38);
  Am_Style::~Am_Style(local_38);
  printf("Hit RETURN to exit: \n");
  getchar();
  return 0;
}

Assistant:

int
main()
{
  init_windows();
  init_point_lists();
  draw_point_lists(black);

  printf("Hit RETURN to apply change to point-list in D2: \n");
  getchar();

  draw_point_lists(white);
  change_left_point_lists();
  draw_point_lists(black);

  //
  // Exit
  //
  printf("Hit RETURN to exit: \n");
  getchar();

  return 0;
}